

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_wString __thiscall ON_SubD_ComponentIdTypeAndTag::ToString(ON_SubD_ComponentIdTypeAndTag *this)

{
  Type TVar1;
  ON_SubDVertexTag OVar2;
  ON_SubDEdgeTag OVar3;
  ON_SubD_ComponentIdTypeAndTag *in_RSI;
  ON_wString local_20;
  ON_wString local_18;
  
  TVar1 = in_RSI->m_type;
  if (TVar1 == Face) {
    ON_wString::FormatToString
              ((wchar_t *)this,L"Face id=%u tag=%u",(ulong)in_RSI->m_id,
               (ulong)(in_RSI->m_tag_and_dirx & 7));
  }
  else {
    if (TVar1 == Edge) {
      ON_wString::FormatToString((wchar_t *)&local_18,L"Edge id=%u tag=",(ulong)in_RSI->m_id);
      OVar3 = EdgeTag(in_RSI);
      ON_wString::ON_wString(&local_20,*(wchar_t **)(&DAT_00819c18 + (ulong)OVar3 * 8));
      ON_wString::operator+((ON_wString *)this,&local_18);
    }
    else {
      if (TVar1 != Vertex) {
        ON_wString::ON_wString((ON_wString *)this,L"Unset");
        return (ON_wString)(wchar_t *)this;
      }
      ON_wString::FormatToString((wchar_t *)&local_18,L"Vertex id=%u tag=",(ulong)in_RSI->m_id);
      OVar2 = VertexTag(in_RSI);
      ON_wString::ON_wString(&local_20,*(wchar_t **)(&DAT_00819bf0 + (ulong)OVar2 * 8));
      ON_wString::operator+((ON_wString *)this,&local_18);
    }
    ON_wString::~ON_wString(&local_20);
    ON_wString::~ON_wString(&local_18);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_SubD_ComponentIdTypeAndTag::ToString() const
{
  switch (m_type)
  {
  case ON_SubDComponentPtr::Type::Unset:
    break;
  case ON_SubDComponentPtr::Type::Vertex:
    return ON_wString::FormatToString(L"Vertex id=%u tag=",m_id) + ON_SubD::VertexTagToString(VertexTag(),false);
    break;
  case ON_SubDComponentPtr::Type::Edge:
    return ON_wString::FormatToString(L"Edge id=%u tag=",m_id) + ON_SubD::EdgeTagToString(EdgeTag(), false);
    break;
  case ON_SubDComponentPtr::Type::Face:
    return ON_wString::FormatToString(L"Face id=%u tag=%u", m_id, (unsigned)FaceTag());
    break;
  default:
    break;
  }
  return ON_wString(L"Unset");
}